

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O3

optional<unsigned_long_long> __thiscall QMetaEnum::keyToValue64(QMetaEnum *this,char *key)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  _Storage<unsigned_long_long,_true> _Var4;
  QMetaEnum *e;
  QMetaObject *pQVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  char cVar9;
  undefined1 *__n;
  undefined1 *__s1;
  undefined7 extraout_var;
  undefined4 extraout_var_00;
  _Storage<unsigned_long_long,_true> _Var10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  long in_FS_OFFSET;
  QByteArrayView qualifiedKey;
  optional<unsigned_long_long> oVar16;
  QByteArrayView scope_00;
  optional<QByteArrayView> scope;
  _Storage<QByteArrayView,_true> local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  _Storage<unsigned_long_long,_true> local_38;
  
  local_38 = (_Storage<unsigned_long_long,_true>)
             ((_Storage<unsigned_long_long,_true> *)(in_FS_OFFSET + 0x28))->_M_value;
  uVar11 = 0;
  _Var10 = local_38;
  if ((key != (char *)0x0) && (this->mobj != (QMetaObject *)0x0)) {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68._M_value.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68._M_value.m_data = &DAT_aaaaaaaaaaaaaaaa;
    lVar12 = -1;
    do {
      lVar6 = lVar12 + 1;
      lVar12 = lVar12 + 1;
    } while (key[lVar6] != '\0');
    qualifiedKey.m_data = key;
    qualifiedKey.m_size = lVar12;
    parse_scope((R_conflict6 *)&local_68._M_value,qualifiedKey);
    __s1 = local_48;
    __n = puStack_50;
    uVar8 = local_68._M_value.m_data;
    uVar7 = local_68._M_value.m_size;
    _Var4 = (_Storage<unsigned_long_long,_true>)(this->data).d;
    uVar15 = *(uint *)(_Var4._M_value + 0xc);
    uVar11 = 0;
    _Var10 = _Var4;
    if (0 < (int)uVar15) {
      cVar9 = (char)local_58;
      e = (QMetaEnum *)this->mobj;
      iVar14 = uVar15 * -2;
      iVar13 = -1;
      do {
        if (cVar9 == '\0') {
LAB_00283003:
          _Var10 = (_Storage<unsigned_long_long,_true>)(e->data).d;
          pQVar5 = e[1].mobj;
          uVar1 = *(uint *)(_Var4._M_value + 0x10);
          iVar2 = *(int *)((long)&(pQVar5->d).superdata.direct + (ulong)((int)uVar11 + uVar1) * 4);
          if (__n == (undefined1 *)(ulong)*(uint *)(_Var10._M_value + (long)(iVar2 * 2 + 1) * 4)) {
            if (__n != (undefined1 *)0x0) {
              _Var10._M_value._0_4_ =
                   bcmp(__s1,(void *)(*(uint *)(_Var10._M_value + (long)iVar2 * 8) + _Var10._M_value
                                     ),(size_t)__n);
              _Var10._M_value._4_4_ = extraout_var_00;
              if (_Var10._M_value._0_4_ != 0) goto LAB_00283069;
            }
            if ((*(uint *)(_Var4._M_value + 8) & 0x40) == 0) {
              if ((*(uint *)(_Var4._M_value + 8) & 1) == 0) {
                lVar12 = *(long *)(e[2].data.d +
                                  ((long)*(int *)&(pQVar5->d).static_metacall +
                                  (ulong)(uint)((int)(_Var4._M_value - (long)pQVar5 >> 2) -
                                               *(int *)((long)&(pQVar5->d).relatedMetaObjects + 4))
                                  / 5) * 2);
                if (lVar12 == 0) {
                  _Var10 = (_Storage<unsigned_long_long,_true>)
                           (long)*(int *)((long)&(pQVar5->d).superdata.direct +
                                         (ulong)(uVar1 - iVar13) * 4);
                }
                else {
                  uVar3 = *(uint *)((long)&(pQVar5->d).superdata.direct +
                                   (ulong)(uVar1 - iVar13) * 4);
                  _Var10._M_value._4_4_ = 0;
                  _Var10._M_value._0_4_ = uVar3;
                  if ((*(uint *)(lVar12 + 8) >> 8 & 1) == 0) {
                    _Var10 = (_Storage<unsigned_long_long,_true>)(long)(int)uVar3;
                  }
                }
              }
              else {
                _Var10._M_value._4_4_ = 0;
                _Var10._M_value._0_4_ =
                     *(uint *)((long)&(pQVar5->d).superdata.direct + (ulong)(uVar1 - iVar13) * 4);
              }
            }
            else {
              _Var10._M_value._4_4_ =
                   *(undefined4 *)
                    ((long)&(pQVar5->d).superdata.direct + (ulong)(uVar1 - iVar14) * 4);
              _Var10._M_value._0_4_ =
                   *(undefined4 *)
                    ((long)&(pQVar5->d).superdata.direct + (ulong)(uVar1 - iVar13) * 4);
            }
            uVar11 = CONCAT71((int7)(uVar11 >> 8),1);
            goto LAB_0028307e;
          }
        }
        else {
          scope_00.m_data = (storage_type *)uVar8;
          scope_00.m_size = uVar7;
          _Var10._0_1_ = isScopeMatch(scope_00,e);
          _Var10._M_value._1_7_ = extraout_var;
          if (_Var10._0_1_) goto LAB_00283003;
        }
LAB_00283069:
        iVar14 = iVar14 + -1;
        iVar13 = iVar13 + -2;
        uVar11 = (ulong)((int)uVar11 + 2);
        uVar15 = uVar15 - 1;
      } while (uVar15 != 0);
      uVar11 = 0;
    }
  }
LAB_0028307e:
  if (*(uint **)(in_FS_OFFSET + 0x28) != (uint *)local_38._M_value) {
    __stack_chk_fail();
  }
  oVar16.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long_long>._8_8_ = uVar11;
  oVar16.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long_long>._M_payload._M_value = _Var10._M_value;
  return (optional<unsigned_long_long>)
         oVar16.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long_long>;
}

Assistant:

std::optional<quint64> QMetaEnum::keyToValue64(const char *key) const
{
    if (!mobj || !key)
        return std::nullopt;
    const auto [scope, enumKey] = parse_scope(QLatin1StringView(key));
    for (int i = 0; i < int(data.keyCount()); ++i) {
        if ((!scope || isScopeMatch(*scope, this))
            && enumKey == stringDataView(mobj, mobj->d.data[data.data() + 2 * i])) {
            return value_helper(i);
        }
    }
    return std::nullopt;
}